

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1a85c0::CommandLineParser::ResetAllOptionOccurrences(CommandLineParser *this)

{
  uint *puVar1;
  long *plVar2;
  void **ppvVar3;
  uint *puVar4;
  long *plVar5;
  ulong uVar6;
  uint *puVar7;
  iterator __begin1;
  SmallPtrSetIteratorImpl local_40;
  SmallPtrSetIteratorImpl local_30;
  
  local_30.Bucket =
       (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
       super_SmallPtrSetImplBase.CurArray;
  puVar1 = &(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
            super_SmallPtrSetImplBase.NumNonEmpty;
  puVar7 = &(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
            super_SmallPtrSetImplBase.CurArraySize;
  puVar4 = puVar7;
  if (local_30.Bucket ==
      (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
      super_SmallPtrSetImplBase.SmallArray) {
    puVar4 = puVar1;
  }
  local_30.End = local_30.Bucket + *puVar4;
  llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_30);
  local_40.Bucket = local_30.Bucket;
  local_40.End = local_30.End;
  local_30.Bucket =
       (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
       super_SmallPtrSetImplBase.CurArray;
  if (local_30.Bucket ==
      (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
      super_SmallPtrSetImplBase.SmallArray) {
    puVar7 = puVar1;
  }
  local_30.Bucket = local_30.Bucket + *puVar7;
  local_30.End = local_30.Bucket;
  llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_30);
  ppvVar3 = local_30.Bucket;
  if (local_40.Bucket != local_30.Bucket) {
    do {
      if (local_40.End <= local_40.Bucket) {
        __assert_fail("Bucket < End",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                      ,0x122,
                      "const PtrTy llvm::SmallPtrSetIterator<llvm::cl::SubCommand *>::operator*() const [PtrTy = llvm::cl::SubCommand *]"
                     );
      }
      plVar2 = *(long **)((long)*local_40.Bucket + 0x80);
      uVar6 = (ulong)*(uint *)((long)*local_40.Bucket + 0x88);
      plVar5 = plVar2;
      if (uVar6 != 0) {
        for (; (*plVar5 == 0 || (*plVar5 == -8)); plVar5 = plVar5 + 1) {
        }
      }
      while (plVar5 != plVar2 + uVar6) {
        *(undefined4 *)(*(long *)(*plVar5 + 8) + 8) = 0;
        do {
          do {
            plVar5 = plVar5 + 1;
          } while (*plVar5 == 0);
        } while (*plVar5 == -8);
      }
      local_40.Bucket = local_40.Bucket + 1;
      llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_40);
    } while (local_40.Bucket != ppvVar3);
  }
  return;
}

Assistant:

void CommandLineParser::ResetAllOptionOccurrences() {
  // So that we can parse different command lines multiple times in succession
  // we reset all option values to look like they have never been seen before.
  for (auto SC : RegisteredSubCommands) {
    for (auto &O : SC->OptionsMap)
      O.second->reset();
  }
}